

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O1

RpcValue __thiscall
miniros::master::Master::unregisterSubscriber
          (Master *this,string *caller_id,string *topic,string *caller_api,Connection *connection)

{
  Error EVar1;
  XmlRpcValue *pXVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  size_type *psVar6;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  anon_union_8_8_d5adaace_for__value extraout_RDX_00;
  anon_union_8_8_d5adaace_for__value extraout_RDX_01;
  anon_union_8_8_d5adaace_for__value aVar7;
  ulong uVar8;
  long in_R9;
  RpcValue RVar9;
  string local_198;
  int ret;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  XmlRpcValue local_110;
  long *local_100 [2];
  long local_f0 [2];
  RequesterInfo requesterInfo;
  
  XmlRpc::XmlRpcValue::Array((XmlRpcValue *)this,3);
  RequesterInfo::RequesterInfo(&requesterInfo);
  EVar1 = RequesterInfo::assign(&requesterInfo,topic,*(int *)(in_R9 + 8));
  if (EVar1.code != Ok) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (unregisterSubscriber::loc.initialized_ == false) {
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,"miniros.unknown_package","");
      console::initializeLogLocation(&unregisterSubscriber::loc,&local_198,Warn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
    }
    if (unregisterSubscriber::loc.level_ != Warn) {
      console::setLogLocationLevel(&unregisterSubscriber::loc,Warn);
      console::checkLogLocationEnabled(&unregisterSubscriber::loc);
    }
    if (unregisterSubscriber::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,unregisterSubscriber::loc.logger_,
                     unregisterSubscriber::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp"
                     ,0x13e,
                     "Master::RpcValue miniros::master::Master::unregisterSubscriber(const std::string &, const std::string &, const std::string &, Connection *)"
                     ,"Failed to read network address of caller %s",(topic->_M_dataplus)._M_p);
    }
  }
  ::std::__cxx11::string::_M_assign((string *)&requesterInfo.callerApi);
  ret = MasterHandler::unregisterSubscriber
                  ((MasterHandler *)(caller_id + 0x13),&requesterInfo,caller_api);
  local_198._M_dataplus._M_p._0_4_ = 1;
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar2,(int *)&local_198);
  local_100[0] = local_f0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"unregistered ","");
  plVar3 = (long *)::std::__cxx11::string::_M_append
                             ((char *)local_100,(ulong)(topic->_M_dataplus)._M_p);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_140 = *puVar5;
    uStack_138 = (undefined4)plVar3[3];
    uStack_134 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar5;
    local_150 = (ulong *)*plVar3;
  }
  local_148 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_130 = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"as provder of ","");
  uVar8 = 0xf;
  if (local_150 != &local_140) {
    uVar8 = local_140;
  }
  if (uVar8 < (ulong)(local_128 + local_148)) {
    uVar8 = 0xf;
    if (local_130 != local_120) {
      uVar8 = local_120[0];
    }
    if ((ulong)(local_128 + local_148) <= uVar8) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_150);
      goto LAB_0022f165;
    }
  }
  puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130);
LAB_0022f165:
  local_170 = &local_160;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_160 = *plVar3;
    uStack_158 = puVar4[3];
  }
  else {
    local_160 = *plVar3;
    local_170 = (long *)*puVar4;
  }
  local_168 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_170,(ulong)(caller_api->_M_dataplus)._M_p);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_198.field_2._M_allocated_capacity = *psVar6;
    local_198.field_2._8_8_ = plVar3[3];
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar6;
    local_198._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_198._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_110,&local_198);
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&local_110);
  XmlRpc::XmlRpcValue::invalidate(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&ret);
  network::NetAddress::~NetAddress(&requesterInfo.localAddress);
  network::NetAddress::~NetAddress(&requesterInfo.clientAddress);
  aVar7 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)requesterInfo.callerApi._M_dataplus._M_p != &requesterInfo.callerApi.field_2) {
    operator_delete(requesterInfo.callerApi._M_dataplus._M_p,
                    requesterInfo.callerApi.field_2._M_allocated_capacity + 1);
    aVar7 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)requesterInfo.callerId._M_dataplus._M_p != &requesterInfo.callerId.field_2) {
    operator_delete(requesterInfo.callerId._M_dataplus._M_p,
                    requesterInfo.callerId.field_2._M_allocated_capacity + 1);
    aVar7 = extraout_RDX_01;
  }
  RVar9._value.asDouble = aVar7.asDouble;
  RVar9._0_8_ = this;
  return RVar9;
}

Assistant:

Master::RpcValue Master::unregisterSubscriber(
  const std::string& caller_id, const std::string& topic, const std::string& caller_api, Connection* connection)
{
  RpcValue res = RpcValue::Array(3);
  RequesterInfo requesterInfo;
  if (!requesterInfo.assign(caller_id, connection->getfd())) {
    MINIROS_WARN("Failed to read network address of caller %s", caller_id.c_str());
  }
  requesterInfo.callerApi = caller_api;

  int ret = m_handler.unregisterSubscriber(requesterInfo, topic);
  res[0] = 1;
  res[1] = std::string("unregistered ") + caller_id + std::string("as provder of ") + topic;
  res[2] = ret;
  return res;
}